

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_join_mcast.c
# Opt level: O0

int os_fd_generic_join_mcast_send
              (os_fd *sock,netaddr *multicast,os_interface *os_if,_Bool loop,uint8_t ttl,
              oonf_log_source log_src)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int *piVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 in_stack_fffffffffffffd68;
  undefined4 uVar8;
  uint local_268;
  uint local_220;
  uint local_1d8;
  undefined1 local_1d4 [4];
  uint i;
  netaddr_str buf2;
  netaddr_str buf1;
  oonf_log_source log_src_local;
  uint8_t ttl_local;
  _Bool loop_local;
  os_interface *os_if_local;
  netaddr *multicast_local;
  os_fd *sock_local;
  
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  if (multicast->_type == '\x02') {
    if (((&log_global_mask)[log_src] & 1) != 0) {
      uVar3 = netaddr_to_prefixstring(local_1d4,multicast,0);
      uVar4 = netaddr_to_prefixstring(buf2.buf + 0x36,os_if->if_v4,0);
      oonf_log(1,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0x8e,0,0,
               "Socket on interface %s joining sending multicast %s (src %s)\n",os_if->name,uVar3,
               uVar4);
    }
    iVar2 = setsockopt(sock->fd,0,0x20,os_if->if_v4,4);
    if (iVar2 < 0) {
      if (((&log_global_mask)[log_src] & 4) != 0) {
        uVar3 = netaddr_to_prefixstring(local_1d4,multicast,0);
        uVar4 = netaddr_to_prefixstring(buf2.buf + 0x36,os_if->if_v4,0);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        piVar5 = __errno_location();
        oonf_log(4,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0x93,0,0,
                 "Cannot set multicast %s on interface %s (src %s): %s (%d)\n",uVar3,os_if->name,
                 uVar4,pcVar6,*piVar5);
      }
      return -1;
    }
    local_1d8 = (uint)loop;
    iVar2 = setsockopt(sock->fd,0,0x22,&local_1d8,4);
    if (iVar2 < 0) {
      if (((&log_global_mask)[log_src] & 4) != 0) {
        pcVar6 = "de";
        if (loop) {
          pcVar6 = "";
        }
        piVar5 = __errno_location();
        pcVar7 = strerror(*piVar5);
        piVar5 = __errno_location();
        oonf_log(4,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0x9a,0,0,
                 "Cannot %sactivate local loop of multicast interface: %s (%d)\n",pcVar6,pcVar7,
                 *piVar5);
      }
      return -1;
    }
    if (ttl == '\0') {
      local_220 = 1;
    }
    else {
      local_220 = (uint)ttl;
    }
    local_1d8 = local_220;
    iVar2 = setsockopt(sock->fd,0,0x21,&local_1d8,4);
    uVar1 = local_1d8;
    if (iVar2 < 0) {
      if (((&log_global_mask)[log_src] & 4) != 0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        piVar5 = __errno_location();
        oonf_log(4,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0xa0,0,0,
                 "Cannot set multicast TTL to %u: %s (%d)",uVar1,pcVar6,*piVar5);
      }
      return -1;
    }
  }
  else {
    if (((&log_global_mask)[log_src] & 1) != 0) {
      uVar1 = os_if->index;
      uVar3 = netaddr_to_prefixstring(local_1d4,multicast,0);
      uVar4 = netaddr_to_prefixstring(buf2.buf + 0x36,os_if->if_linklocal_v6,0);
      oonf_log(1,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0xa6,0,0,
               "Socket on interface %s (%d) joining sending multicast %s (src %s)\n",os_if->name,
               CONCAT44(uVar8,uVar1),uVar3,uVar4);
    }
    iVar2 = setsockopt(sock->fd,0x29,0x11,&os_if->index,4);
    if (iVar2 < 0) {
      if (((&log_global_mask)[log_src] & 4) != 0) {
        uVar3 = netaddr_to_prefixstring(local_1d4,multicast,0);
        uVar4 = netaddr_to_prefixstring(buf2.buf + 0x36,os_if->if_linklocal_v6,0);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        piVar5 = __errno_location();
        oonf_log(4,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0xab,0,0,
                 "Cannot set multicast %s on interface %s (src %s): %s (%d)\n",uVar3,os_if->name,
                 uVar4,pcVar6,*piVar5);
      }
      return -1;
    }
    local_1d8 = (uint)loop;
    iVar2 = setsockopt(sock->fd,0x29,0x13,&local_1d8,4);
    if (iVar2 < 0) {
      if (((&log_global_mask)[log_src] & 4) != 0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        piVar5 = __errno_location();
        oonf_log(4,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0xb1,0,0,
                 "Cannot deactivate local loop of multicast interface: %s (%d)\n",pcVar6,*piVar5);
      }
      return -1;
    }
    if (ttl == '\0') {
      local_268 = 1;
    }
    else {
      local_268 = (uint)ttl;
    }
    local_1d8 = local_268;
    iVar2 = setsockopt(sock->fd,0x29,0x12,&local_1d8,4);
    uVar1 = local_1d8;
    if (iVar2 < 0) {
      if (((&log_global_mask)[log_src] & 4) != 0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        piVar5 = __errno_location();
        oonf_log(4,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0xb7,0,0,
                 "Cannot set multicast TTL to %u: %s (%d)",uVar1,pcVar6,*piVar5);
      }
      return -1;
    }
  }
  return 0;
}

Assistant:

int
os_fd_generic_join_mcast_send(struct os_fd *sock, const struct netaddr *multicast, const struct os_interface *os_if,
  bool loop, uint8_t ttl, enum oonf_log_source log_src __attribute__((unused))) {
  struct netaddr_str buf1, buf2;
  unsigned i;

  if (netaddr_get_address_family(multicast) == AF_INET) {
    OONF_DEBUG(log_src, "Socket on interface %s joining sending multicast %s (src %s)\n", os_if->name,
      netaddr_to_string(&buf2, multicast), netaddr_to_string(&buf1, os_if->if_v4));

    if (setsockopt(sock->fd, IPPROTO_IP, IP_MULTICAST_IF, netaddr_get_binptr(os_if->if_v4), 4) < 0) {
      OONF_WARN(log_src, "Cannot set multicast %s on interface %s (src %s): %s (%d)\n",
        netaddr_to_string(&buf2, multicast), os_if->name, netaddr_to_string(&buf1, os_if->if_v4), strerror(errno),
        errno);
      return -1;
    }

    i = loop ? 1 : 0;
    if (setsockopt(sock->fd, IPPROTO_IP, IP_MULTICAST_LOOP, (char *)&i, sizeof(i)) < 0) {
      OONF_WARN(log_src, "Cannot %sactivate local loop of multicast interface: %s (%d)\n", loop ? "" : "de",
        strerror(errno), errno);
      return -1;
    }

    i = ttl > 0 ? ttl : 1;
    if (setsockopt(sock->fd, IPPROTO_IP, IP_MULTICAST_TTL, &i, sizeof(i)) < 0) {
      OONF_WARN(log_src, "Cannot set multicast TTL to %u: %s (%d)", i, strerror(errno), errno);
      return -1;
    }
  }
  else {
    OONF_DEBUG(log_src, "Socket on interface %s (%d) joining sending multicast %s (src %s)\n", os_if->name,
      os_if->index, netaddr_to_string(&buf2, multicast), netaddr_to_string(&buf1, os_if->if_linklocal_v6));

    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_MULTICAST_IF, &os_if->index, sizeof(os_if->index)) < 0) {
      OONF_WARN(log_src, "Cannot set multicast %s on interface %s (src %s): %s (%d)\n",
        netaddr_to_string(&buf2, multicast), os_if->name, netaddr_to_string(&buf1, os_if->if_linklocal_v6),
        strerror(errno), errno);
      return -1;
    }

    i = loop ? 1 : 0;
    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_MULTICAST_LOOP, &i, sizeof(i)) < 0) {
      OONF_WARN(log_src, "Cannot deactivate local loop of multicast interface: %s (%d)\n", strerror(errno), errno);
      return -1;
    }

    i = ttl > 0 ? ttl : 1;
    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_MULTICAST_HOPS, &i, sizeof(i)) < 0) {
      OONF_WARN(log_src, "Cannot set multicast TTL to %u: %s (%d)", i, strerror(errno), errno);
      return -1;
    }
  }
  return 0;
}